

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

void __thiscall
FString::Substitute(FString *this,char *oldstr,char *newstr,size_t oldstrlen,size_t newstrlen)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  
  LockBuffer(this);
  uVar3 = 0;
  while( true ) {
    pcVar5 = this->Chars;
    uVar4 = (ulong)*(uint *)(pcVar5 + -0xc);
    if (uVar4 <= uVar3) break;
    pcVar1 = strstr(pcVar5 + uVar3,oldstr);
    if (pcVar1 == (char *)0x0) break;
    lVar2 = (long)pcVar1 - (long)pcVar5;
    if (newstrlen != oldstrlen) {
      ReallocBuffer(this,(newstrlen - oldstrlen) + uVar4);
      memmove(this->Chars + newstrlen + lVar2,this->Chars + oldstrlen + lVar2,
              (uVar4 - (oldstrlen + lVar2)) + 1);
      pcVar5 = this->Chars;
    }
    memcpy(pcVar5 + lVar2,newstr,newstrlen);
    uVar3 = lVar2 + newstrlen;
  }
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::Substitute (const char *oldstr, const char *newstr, size_t oldstrlen, size_t newstrlen)
{
	LockBuffer();
	for (size_t checkpt = 0; checkpt < Len(); )
	{
		char *match = strstr (Chars + checkpt, oldstr);
		size_t len = Len();
		if (match != NULL)
		{
			size_t matchpt = match - Chars;
			if (oldstrlen != newstrlen)
			{
				ReallocBuffer (len + newstrlen - oldstrlen);
				memmove (Chars + matchpt + newstrlen, Chars + matchpt + oldstrlen, (len + 1 - matchpt - oldstrlen)*sizeof(char));
			}
			memcpy (Chars + matchpt, newstr, newstrlen);
			checkpt = matchpt + newstrlen;
		}
		else
		{
			break;
		}
	}
	UnlockBuffer();
}